

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-to-source.cpp
# Opt level: O0

void get_lines_from_module
               (Module *M,
               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *lines)

{
  bool bVar1;
  reference this;
  DebugLoc *__x;
  Module *in_RSI;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar2;
  DebugLoc *Loc;
  Instruction *I;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *B;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Function *F;
  const_iterator __end1;
  const_iterator __begin1;
  Module *__range1;
  Module *in_stack_ffffffffffffff68;
  _Rb_tree_const_iterator<unsigned_int> in_stack_ffffffffffffff70;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_68;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_60;
  reference local_58;
  reference local_50;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_48;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_40;
  reference local_38;
  reference local_30;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_28;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_20 [2];
  Module *local_10;
  
  local_10 = in_RSI;
  local_20[0].NodePtr = (node_pointer)llvm::Module::begin(in_stack_ffffffffffffff68);
  local_28.NodePtr = (node_pointer)llvm::Module::end(in_stack_ffffffffffffff68);
  while (bVar1 = llvm::operator!=(local_20,&local_28), bVar1) {
    local_38 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x10ebfd);
    local_30 = local_38;
    local_40.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_ffffffffffffff68);
    local_48.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_ffffffffffffff68);
    while (bVar1 = llvm::operator!=(&local_40,&local_48), bVar1) {
      local_58 = llvm::
                 ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                 ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                              *)0x10ec4c);
      local_50 = local_58;
      local_60.NodePtr =
           (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_ffffffffffffff68);
      local_68.NodePtr =
           (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_ffffffffffffff68);
      while (bVar1 = llvm::operator!=(&local_60,&local_68), bVar1) {
        this = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                            *)0x10ec98);
        __x = llvm::Instruction::getDebugLoc(this);
        bVar1 = llvm::DebugLoc::operator_cast_to_bool((DebugLoc *)0x10ecb6);
        if (bVar1) {
          in_stack_ffffffffffffff68 = local_10;
          llvm::DebugLoc::getLine();
          pVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)this,(value_type_conflict *)__x);
          in_stack_ffffffffffffff70 = pVar2.first._M_node;
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                      *)in_stack_ffffffffffffff70._M_node);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                    *)in_stack_ffffffffffffff70._M_node);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffff70._M_node);
  }
  return;
}

Assistant:

static void get_lines_from_module(const llvm::Module &M,
                                  std::set<unsigned> &lines) {
    // iterate over all instructions
    for (const auto &F : M) {
        for (const auto &B : F) {
            for (const auto &I : B) {
                const auto &Loc = I.getDebugLoc();
                // Make sure that the llvm istruction has corresponding dbg LOC
#if ((LLVM_VERSION_MAJOR > 3) ||                                               \
     ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR > 6)))
                if (Loc)
#else
                if (Loc.getLine() > 0)
#endif
                    lines.insert(Loc.getLine());
            }
        }
    }

    // iterate over all globals
    /*
    for (const GlobalVariable& G : M->globals()) {
        const DebugLoc& Loc = G.getDebugLoc();
        lines.insert(Loc.getLine());
    }
    */
}